

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::AddSymbol
          (DescriptorIndex *this,string_view symbol)

{
  btree_set<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
  *this_00;
  pointer pSVar1;
  string_view sub_symbol;
  undefined8 uVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  bool bVar5;
  reference pSVar6;
  __normal_iterator<const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>_>
  _Var7;
  LogMessage *pLVar8;
  char *extraout_RDX;
  string *this_01;
  __normal_iterator<const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>_>
  this_02;
  SymbolEntry *this_03;
  string_view name;
  const_iterator hint;
  string_view v;
  string_view v_00;
  string_view v_01;
  string_view v_02;
  const_iterator cVar9;
  iterator iVar10;
  string_view super_symbol;
  string_view super_symbol_00;
  string_view super_symbol_01;
  string_view super_symbol_02;
  string_view sub_symbol_00;
  string_view sub_symbol_01;
  string_view sub_symbol_02;
  string local_e0;
  btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
  local_c0;
  string local_b0;
  undefined1 local_90 [24];
  string entry_as_string;
  SymbolEntry entry;
  
  entry.data_offset =
       (int)(((long)(this->all_values_).
                    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->all_values_).
                   super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x30) + -1;
  EncodeString_abi_cxx11_(&entry.encoded_symbol,this,symbol);
  SymbolEntry::AsString_abi_cxx11_(&entry_as_string,&entry,this);
  name._M_str = extraout_RDX;
  name._M_len = (size_t)symbol._M_str;
  bVar5 = anon_unknown_23::ValidateSymbolName((anon_unknown_23 *)symbol._M_len,name);
  if (bVar5) {
    this_00 = &this->by_symbol_;
    cVar9 = absl::lts_20250127::container_internal::
            btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
            ::upper_bound<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>
                      ((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
                        *)this_00,&entry);
    local_e0._M_dataplus._M_p = (pointer)cVar9.node_;
    local_e0._M_string_length._0_4_ = cVar9.position_;
    cVar9 = absl::lts_20250127::container_internal::
            btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
            ::begin((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
                     *)this_00);
    local_b0._M_dataplus._M_p = (pointer)cVar9.node_;
    local_b0._M_string_length._0_4_ = cVar9.position_;
    bVar5 = absl::lts_20250127::container_internal::
            btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
            ::operator!=((btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
                          *)&local_e0,(const_iterator *)&local_b0);
    if (bVar5) {
      absl::lts_20250127::container_internal::
      btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
      ::decrement((btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
                   *)&local_e0);
    }
    sVar4 = entry_as_string._M_string_length;
    _Var3._M_p = entry_as_string._M_dataplus._M_p;
    local_c0.node_ =
         (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
          *)local_e0._M_dataplus._M_p;
    local_c0.position_ = (int)local_e0._M_string_length;
    iVar10 = absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
             ::end((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
                    *)this_00);
    local_b0._M_dataplus._M_p = (pointer)iVar10.node_;
    local_b0._M_string_length._0_4_ = iVar10.position_;
    bVar5 = absl::lts_20250127::container_internal::
            btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
            ::operator!=(&local_c0,(iterator *)&local_b0);
    local_90._16_8_ = this_00;
    if (bVar5) {
      pSVar6 = absl::lts_20250127::container_internal::
               btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
               ::operator*(&local_c0);
      SymbolEntry::AsString_abi_cxx11_(&local_e0,pSVar6,this);
      sub_symbol_00._M_len._4_4_ = local_e0._M_string_length._4_4_;
      sub_symbol_00._M_len._0_4_ = (int)local_e0._M_string_length;
      super_symbol._M_str = _Var3._M_p;
      super_symbol._M_len = sVar4;
      sub_symbol_00._M_str = local_e0._M_dataplus._M_p;
      bVar5 = anon_unknown_23::IsSubSymbol(sub_symbol_00,super_symbol);
      std::__cxx11::string::~string((string *)&local_e0);
      if (bVar5) {
        absl::lts_20250127::log_internal::LogMessage::LogMessage
                  ((LogMessage *)local_90,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
                   ,0x2c1);
        pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           ((LogMessage *)local_90,(char (*) [14])"Symbol name \"");
        v_00._M_str = _Var3._M_p;
        v_00._M_len = sVar4;
        pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar8,v_00);
        pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           (pLVar8,(char (*) [39])"\" conflicts with the existing symbol \"");
        pSVar6 = absl::lts_20250127::container_internal::
                 btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
                 ::operator*(&local_c0);
        SymbolEntry::AsString_abi_cxx11_(&local_e0,pSVar6,this);
        pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar8,&local_e0);
        absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar8,(char (*) [3])0x2d57d3);
LAB_00185437:
        std::__cxx11::string::~string((string *)&local_e0);
        this_01 = (string *)local_90;
        goto LAB_00185446;
      }
      absl::lts_20250127::container_internal::
      btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
      ::increment(&local_c0);
      bVar5 = absl::lts_20250127::container_internal::
              btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
              ::operator!=(&local_c0,(iterator *)&local_b0);
      if (bVar5) {
        pSVar6 = absl::lts_20250127::container_internal::
                 btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
                 ::operator*(&local_c0);
        SymbolEntry::AsString_abi_cxx11_(&local_e0,pSVar6,this);
        super_symbol_00._M_len._4_4_ = local_e0._M_string_length._4_4_;
        super_symbol_00._M_len._0_4_ = (int)local_e0._M_string_length;
        super_symbol_00._M_str = local_e0._M_dataplus._M_p;
        sub_symbol_01._M_str = _Var3._M_p;
        sub_symbol_01._M_len = sVar4;
        bVar5 = anon_unknown_23::IsSubSymbol(sub_symbol_01,super_symbol_00);
        std::__cxx11::string::~string((string *)&local_e0);
        if (bVar5) {
          absl::lts_20250127::log_internal::LogMessage::LogMessage
                    ((LogMessage *)local_90,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
                     ,0x2cf);
          pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<
                             ((LogMessage *)local_90,(char (*) [14])"Symbol name \"");
          v_02._M_str = _Var3._M_p;
          v_02._M_len = sVar4;
          pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar8,v_02);
          pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<
                             (pLVar8,(char (*) [39])"\" conflicts with the existing symbol \"");
          pSVar6 = absl::lts_20250127::container_internal::
                   btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
                   ::operator*(&local_c0);
          SymbolEntry::AsString_abi_cxx11_(&local_e0,pSVar6,this);
          pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar8,&local_e0);
          absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar8,(char (*) [3])0x2d57d3);
          goto LAB_00185437;
        }
      }
    }
    _Var7 = std::
            __upper_bound<__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_const*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>>>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare>>
                      ((this->by_symbol_flat_).
                       super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->by_symbol_flat_).
                       super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&entry,
                       (_Val_comp_iter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare>
                        )(this->by_symbol_).
                         super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_>
                         .
                         super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_>
                         .tree_.rightmost_.
                         super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>::checked_compare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                         .
                         super_Storage<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>::checked_compare,_0UL,_false>
                         .value.
                         super_checked_compare_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_true>
                         .super_SymbolCompare.index);
    this_02._M_current = _Var7._M_current + -1;
    if (_Var7._M_current ==
        (this->by_symbol_flat_).
        super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      this_02 = _Var7;
    }
    pSVar1 = (this->by_symbol_flat_).
             super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (this_02._M_current != pSVar1) {
      SymbolEntry::AsString_abi_cxx11_(&local_e0,this_02._M_current,this);
      sub_symbol_02._M_len._4_4_ = local_e0._M_string_length._4_4_;
      sub_symbol_02._M_len._0_4_ = (int)local_e0._M_string_length;
      local_b0.field_2._M_allocated_capacity = entry_as_string._M_string_length;
      local_b0.field_2._8_8_ = entry_as_string._M_dataplus._M_p;
      super_symbol_01._M_str = entry_as_string._M_dataplus._M_p;
      super_symbol_01._M_len = entry_as_string._M_string_length;
      sub_symbol_02._M_str = local_e0._M_dataplus._M_p;
      bVar5 = anon_unknown_23::IsSubSymbol(sub_symbol_02,super_symbol_01);
      std::__cxx11::string::~string((string *)&local_e0);
      if (bVar5) {
        absl::lts_20250127::log_internal::LogMessage::LogMessage
                  ((LogMessage *)&local_b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
                   ,0x2c1);
        uVar2 = local_b0.field_2._8_8_;
        pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           ((LogMessage *)&local_b0,(char (*) [14])"Symbol name \"");
        v._M_str = (char *)uVar2;
        v._M_len = local_b0.field_2._M_allocated_capacity;
        pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar8,v);
        pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           (pLVar8,(char (*) [39])"\" conflicts with the existing symbol \"");
        SymbolEntry::AsString_abi_cxx11_(&local_e0,this_02._M_current,this);
        pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar8,&local_e0);
        absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar8,(char (*) [3])0x2d57d3);
LAB_001853a6:
        std::__cxx11::string::~string((string *)&local_e0);
        this_01 = &local_b0;
        goto LAB_00185446;
      }
      this_03 = this_02._M_current + 1;
      if (this_03 != pSVar1) {
        SymbolEntry::AsString_abi_cxx11_(&local_e0,this_03,this);
        sub_symbol._M_str = (char *)local_b0.field_2._8_8_;
        sub_symbol._M_len = local_b0.field_2._M_allocated_capacity;
        super_symbol_02._M_len._4_4_ = local_e0._M_string_length._4_4_;
        super_symbol_02._M_len._0_4_ = (int)local_e0._M_string_length;
        super_symbol_02._M_str = local_e0._M_dataplus._M_p;
        bVar5 = anon_unknown_23::IsSubSymbol(sub_symbol,super_symbol_02);
        std::__cxx11::string::~string((string *)&local_e0);
        if (bVar5) {
          absl::lts_20250127::log_internal::LogMessage::LogMessage
                    ((LogMessage *)&local_b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
                     ,0x2cf);
          uVar2 = local_b0.field_2._8_8_;
          pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<
                             ((LogMessage *)&local_b0,(char (*) [14])"Symbol name \"");
          v_01._M_str = (char *)uVar2;
          v_01._M_len = local_b0.field_2._M_allocated_capacity;
          pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar8,v_01);
          pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<
                             (pLVar8,(char (*) [39])"\" conflicts with the existing symbol \"");
          SymbolEntry::AsString_abi_cxx11_(&local_e0,this_03,this);
          pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar8,&local_e0);
          absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar8,(char (*) [3])0x2d57d3);
          goto LAB_001853a6;
        }
      }
    }
    bVar5 = true;
    hint.position_ = local_c0.position_;
    hint.node_ = local_c0.node_;
    hint._12_4_ = 0;
    absl::lts_20250127::container_internal::
    btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_>
    ::insert((btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_>
              *)local_90._16_8_,hint,&entry);
  }
  else {
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              ((LogMessage *)&local_e0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x2e4);
    pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       ((LogMessage *)&local_e0,(char (*) [22])"Invalid symbol name: ");
    absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar8,&entry_as_string);
    this_01 = &local_e0;
LAB_00185446:
    absl::lts_20250127::log_internal::LogMessage::~LogMessage((LogMessage *)this_01);
    bVar5 = false;
  }
  std::__cxx11::string::~string((string *)&entry_as_string);
  std::__cxx11::string::~string((string *)&entry.encoded_symbol);
  return bVar5;
}

Assistant:

bool EncodedDescriptorDatabase::DescriptorIndex::AddSymbol(
    absl::string_view symbol) {
  SymbolEntry entry = {static_cast<int>(all_values_.size() - 1),
                       EncodeString(symbol)};
  std::string entry_as_string = entry.AsString(*this);

  // We need to make sure not to violate our map invariant.

  // If the symbol name is invalid it could break our lookup algorithm (which
  // relies on the fact that '.' sorts before all other characters that are
  // valid in symbol names).
  if (!ValidateSymbolName(symbol)) {
    ABSL_LOG(ERROR) << "Invalid symbol name: " << entry_as_string;
    return false;
  }

  auto iter = FindLastLessOrEqual(&by_symbol_, entry);
  if (!CheckForMutualSubsymbols(entry_as_string, &iter, by_symbol_.end(),
                                *this)) {
    return false;
  }

  // Same, but on by_symbol_flat_
  auto flat_iter =
      FindLastLessOrEqual(&by_symbol_flat_, entry, by_symbol_.key_comp());
  if (!CheckForMutualSubsymbols(entry_as_string, &flat_iter,
                                by_symbol_flat_.end(), *this)) {
    return false;
  }

  // OK, no conflicts.

  // Insert the new symbol using the iterator as a hint, the new entry will
  // appear immediately before the one the iterator is pointing at.
  by_symbol_.insert(iter, entry);

  return true;
}